

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

enable_if_t<true,_uintwide_t<256U,_unsigned_int,_void,_true>_> *
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::limits_helper_max<true>(void)

{
  uint val;
  iterator first;
  iterator last;
  reference puVar1;
  array<unsigned_int,_8UL> *in_RDI;
  uintwide_t<256U,_unsigned_int,_void,_true> *result_max;
  limb_type high_bit_limb;
  
  memset(in_RDI,0,0x20);
  uintwide_t((uintwide_t<256U,_unsigned_int,_void,_true> *)in_RDI);
  first = detail::array_detail::array<unsigned_int,_8UL>::begin(in_RDI);
  last = detail::array_detail::array<unsigned_int,_8UL>::end(in_RDI);
  val = std::numeric_limits<unsigned_int>::max();
  detail::fill_unsafe<unsigned_int*,unsigned_int>(first,last,val);
  puVar1 = detail::array_detail::array<unsigned_int,_8UL>::back(in_RDI);
  *puVar1 = *puVar1 ^ 0x80000000;
  return (enable_if_t<true,_uintwide_t<256U,_unsigned_int,_void,_true>_> *)in_RDI;
}

Assistant:

static constexpr auto limits_helper_max() -> std::enable_if_t<RePhraseIsSigned, uintwide_t>
    {
      uintwide_t result_max { };

      detail::fill_unsafe(result_max.values.begin(), result_max.values.end(), (std::numeric_limits<limb_type>::max)());

      constexpr auto high_bit_limb =
        static_cast<limb_type>
        (
          static_cast<limb_type>(UINT8_C(1)) << static_cast<unsigned>(std::numeric_limits<limb_type>::digits - static_cast<int>(INT8_C(1)))
        );

      result_max.values.back() ^= high_bit_limb;

      return result_max;
    }